

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
Lodtalk::ASTInterpreter::ASTInterpreter
          (ASTInterpreter *this,InterpreterProxy *interpreter,EvaluationScopePtr *initialScope,
          Oop currentSelf)

{
  int iVar1;
  undefined4 extraout_var;
  EvaluationScopePtr *initialScope_local;
  InterpreterProxy *interpreter_local;
  ASTInterpreter *this_local;
  Oop currentSelf_local;
  
  this_local = (ASTInterpreter *)currentSelf.field_0;
  iVar1 = (**interpreter->_vptr_InterpreterProxy)();
  ScopedInterpreter::ScopedInterpreter
            (&this->super_ScopedInterpreter,(VMContext *)CONCAT44(extraout_var,iVar1),initialScope);
  (this->super_ScopedInterpreter).super_AbstractASTVisitor.super_ASTVisitor._vptr_ASTVisitor =
       (_func_int **)&PTR_visitArgument_0020d420;
  this->interpreter = interpreter;
  OopRef::OopRef(&this->currentSelf,(this->super_ScopedInterpreter).context,(Oop *)&this_local);
  return;
}

Assistant:

ASTInterpreter(InterpreterProxy *interpreter, const EvaluationScopePtr &initialScope, Oop currentSelf)
		: ScopedInterpreter(interpreter->getContext(), initialScope), interpreter(interpreter), currentSelf(context, currentSelf) {}